

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O0

void __thiscall
ut11::Mock<void(TestEvent<1>)>::VerifyTimes<int,ut11::Operands::IsAny<TestEvent<1>>>
          (Mock<void(TestEvent<1>)> *this,string *param_2,string *param_3,
          IsAny<TestEvent<1>_> *param_4,size_t param_5)

{
  string *line;
  Mock<void(TestEvent<1>)> local_88 [32];
  string local_68 [40];
  size_t local_40;
  size_t actual;
  IsAny<TestEvent<1>_> *expectations_local;
  int *count_local;
  string *file_local;
  size_t line_local;
  Mock<void_(TestEvent<1>)> *this_local;
  
  actual = param_5;
  expectations_local = param_4;
  count_local = (int *)param_3;
  file_local = param_2;
  line_local = (size_t)this;
  local_40 = detail::MockArgumentHandler<TestEvent<1>>::
             CountCalls<ut11::Operands::IsAny<TestEvent<1>>>
                       ((MockArgumentHandler<TestEvent<1>> *)(this + 0x20));
  line = file_local;
  if (local_40 != (long)*(int *)expectations_local) {
    std::__cxx11::string::string(local_68,param_3);
    GetVerifyFailTimesMessageForCount_abi_cxx11_
              (local_88,(size_t)this,(long)*(int *)expectations_local);
    Assert::Fail((size_t)line,(string *)local_68,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string(local_68);
  }
  return;
}

Assistant:

void VerifyTimes(std::true_type isOperand, std::size_t line, std::string file, const Count& count, const Expectations&... expectations) const
		{
			auto actual = m_argumentHandler.CountCalls(expectations...);
			if ( actual != count )
				Assert::Fail(line, file, GetVerifyFailTimesMessageForCount(count, actual));
		}